

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommaInitializer.h
# Opt level: O1

CommaInitializer<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> * __thiscall
Eigen::CommaInitializer<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::operator_
          (CommaInitializer<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *this,Scalar *s)

{
  Index *pIVar1;
  long lVar2;
  Scalar SVar3;
  long lVar4;
  
  if (this->m_col == 3) {
    lVar4 = this->m_currentBlockRows;
    pIVar1 = &this->m_row;
    lVar2 = *pIVar1;
    *pIVar1 = *pIVar1 + lVar4;
    this->m_col = 0;
    this->m_currentBlockRows = 1;
    if (*pIVar1 != 0 && SCARRY8(lVar2,lVar4) == *pIVar1 < 0) {
      __assert_fail("m_row<m_xpr.rows() && \"Too many rows passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/CommaInitializer.h"
                    ,0x45,
                    "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, 1, 3>>::operator,(const Scalar &) [MatrixType = Eigen::Matrix<double, 1, 3>]"
                   );
    }
  }
  lVar2 = this->m_col;
  if (lVar2 < 3) {
    if (this->m_currentBlockRows == 1) {
      SVar3 = *s;
      this->m_col = lVar2 + 1;
      this->m_xpr[this->m_row].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[lVar2] = SVar3;
      return this;
    }
    __assert_fail("m_currentBlockRows==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/CommaInitializer.h"
                  ,0x49,
                  "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, 1, 3>>::operator,(const Scalar &) [MatrixType = Eigen::Matrix<double, 1, 3>]"
                 );
  }
  __assert_fail("m_col<m_xpr.cols() && \"Too many coefficients passed to comma initializer (operator<<)\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/CommaInitializer.h"
                ,0x48,
                "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, 1, 3>>::operator,(const Scalar &) [MatrixType = Eigen::Matrix<double, 1, 3>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
  CommaInitializer& operator,(const Scalar& s)
  {
    if (m_col==m_xpr.cols())
    {
      m_row+=m_currentBlockRows;
      m_col = 0;
      m_currentBlockRows = 1;
      eigen_assert(m_row<m_xpr.rows()
        && "Too many rows passed to comma initializer (operator<<)");
    }
    eigen_assert(m_col<m_xpr.cols()
      && "Too many coefficients passed to comma initializer (operator<<)");
    eigen_assert(m_currentBlockRows==1);
    m_xpr.coeffRef(m_row, m_col++) = s;
    return *this;
  }